

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O3

_Bool art_iterator_lower_bound(art_iterator_t *iterator,art_key_chunk_t *key)

{
  byte bVar1;
  ulong uVar2;
  _Bool _Var3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  art_ref_t ref;
  
  if (iterator->value == (art_val_t *)0x0) {
    iterator->depth = '\0';
    iterator->frame = '\0';
    ref = iterator->frames[0].ref;
    if (ref == 0) {
      return false;
    }
    goto LAB_0011ee7b;
  }
  uVar4 = *(uint *)iterator->key;
  uVar5 = *(uint *)key;
  uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
  uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
  if (uVar4 == uVar5) {
    uVar4 = (uint)(ushort)(*(ushort *)(iterator->key + 4) << 8 | *(ushort *)(iterator->key + 4) >> 8
                          );
    uVar5 = (uint)(ushort)(*(ushort *)(key + 4) << 8 | *(ushort *)(key + 4) >> 8);
    uVar7 = 0;
    if (uVar4 != uVar5) goto LAB_0011edc7;
  }
  else {
LAB_0011edc7:
    uVar7 = -(uint)(uVar4 < uVar5) | 1;
  }
  if (uVar7 != 0) {
    _Var3 = art_iterator_up(iterator);
    if (_Var3) {
      do {
        bVar1 = iterator->frame;
        uVar2 = iterator->frames[bVar1].ref;
        uVar6 = (ulong)(((uint)uVar2 & 0xff) << 3);
        uVar7 = memcmp(iterator,key,
                       (ulong)(byte)(*(char *)(*(long *)((long)iterator->art->nodes + uVar6) +
                                              (uVar2 >> 0x10) *
                                              *(long *)((long)ART_NODE_SIZES + uVar6)) +
                                    iterator->depth));
        if (uVar7 == 0) goto LAB_0011ee72;
        _Var3 = art_iterator_up(iterator);
      } while (_Var3);
    }
    if ((int)uVar7 < 0) {
      iterator->key[4] = '\0';
      iterator->key[5] = '\0';
      iterator->key[0] = '\0';
      iterator->key[1] = '\0';
      iterator->key[2] = '\0';
      iterator->key[3] = '\0';
      iterator->value = (art_val_t *)0x0;
      return false;
    }
    art_node_init_iterator(iterator->frames[iterator->frame].ref,iterator,true);
    return true;
  }
  bVar1 = iterator->frame;
LAB_0011ee72:
  ref = iterator->frames[bVar1].ref;
LAB_0011ee7b:
  _Var3 = art_node_iterator_lower_bound(ref,iterator,key);
  return _Var3;
}

Assistant:

bool art_iterator_lower_bound(art_iterator_t *iterator,
                              const art_key_chunk_t *key) {
    if (iterator->value == NULL) {
        // We're beyond the end / start of the ART so the iterator does not
        // have a valid key. Start from the root.
        iterator->frame = 0;
        iterator->depth = 0;
        art_ref_t root = art_iterator_ref(iterator);
        if (root == CROARING_ART_NULL_REF) {
            return false;
        }
        return art_node_iterator_lower_bound(root, iterator, key);
    }
    int compare_result =
        art_compare_prefix(iterator->key, 0, key, 0, ART_KEY_BYTES);
    // Move up until we have an equal prefix, after which we can do a normal
    // lower bound search.
    while (compare_result != 0) {
        if (!art_iterator_up(iterator)) {
            if (compare_result < 0) {
                // Only smaller keys found.
                return art_iterator_invalid_loc(iterator);
            } else {
                return art_node_init_iterator(art_iterator_ref(iterator),
                                              iterator, true);
            }
        }
        // Since we're only moving up, we can keep comparing against the
        // iterator key.
        art_inner_node_t *inner_node =
            (art_inner_node_t *)art_iterator_node(iterator);
        compare_result =
            art_compare_prefix(iterator->key, 0, key, 0,
                               iterator->depth + inner_node->prefix_size);
    }
    if (compare_result > 0) {
        return art_node_init_iterator(art_iterator_ref(iterator), iterator,
                                      true);
    }
    return art_node_iterator_lower_bound(art_iterator_ref(iterator), iterator,
                                         key);
}